

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

uint32_t * __thiscall
vsencoding::VSEncodingBlocks::decodeVS
          (VSEncodingBlocks *this,uint32_t len,uint32_t *in,uint32_t *out,uint32_t *aux)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint32_t *pblk [16];
  uint *local_c8;
  long alStack_b8 [17];
  
  local_c8 = in + 1;
  uVar11 = (ulong)(int)*in;
  puVar12 = in + uVar11 + 1;
  for (; 0 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
    uVar14 = *local_c8;
    local_c8 = local_c8 + 1;
    uVar15 = uVar14 & 0xf;
    uVar14 = uVar14 >> 4;
    uVar13 = (ulong)(uVar15 * 8);
    (**(code **)(__vseblocks_unpack + uVar13))(aux,puVar12,(ulong)uVar14);
    *(uint32_t **)((long)alStack_b8 + uVar13) = aux;
    aux = aux + uVar14;
    puVar12 = puVar12 + (uVar14 * *(int *)(__vseblocks_possLogs + (ulong)uVar15 * 4) + 0x1f >> 5);
  }
  pauVar1 = (undefined1 (*) [16])(out + len);
  do {
    uVar14 = *puVar12;
    uVar15 = uVar14 >> 0x18 & 0xf;
    if (uVar14 < 0x10000000) {
      *(undefined1 (*) [16])out = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x10) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x20) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x30) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x40) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x50) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x60) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)out + 0x70) = (undefined1  [16])0x0;
      uVar11 = (ulong)(uint)(&__vseblocks_posszLens)[uVar15];
    }
    else {
      puVar3 = (undefined8 *)alStack_b8[uVar14 >> 0x1c];
      uVar4 = puVar3[1];
      uVar5 = puVar3[2];
      uVar6 = puVar3[3];
      uVar7 = puVar3[4];
      uVar8 = puVar3[5];
      uVar9 = puVar3[6];
      uVar10 = puVar3[7];
      *(undefined8 *)*(undefined1 (*) [16])out = *puVar3;
      *(undefined8 *)(*(undefined1 (*) [16])out + 8) = uVar4;
      *(undefined8 *)*(undefined1 (*) [16])((long)out + 0x10) = uVar5;
      *(undefined8 *)(*(undefined1 (*) [16])((long)out + 0x10) + 8) = uVar6;
      *(undefined8 *)*(undefined1 (*) [16])((long)out + 0x20) = uVar7;
      *(undefined8 *)(*(undefined1 (*) [16])((long)out + 0x20) + 8) = uVar8;
      *(undefined8 *)*(undefined1 (*) [16])((long)out + 0x30) = uVar9;
      *(undefined8 *)(*(undefined1 (*) [16])((long)out + 0x30) + 8) = uVar10;
      uVar11 = (ulong)(uint)(&__vseblocks_possLens)[uVar15];
      alStack_b8[uVar14 >> 0x1c] = (long)puVar3 + uVar11 * 4;
    }
    pauVar2 = (undefined1 (*) [16])(*(undefined1 (*) [16])out + uVar11 * 4);
    uVar15 = *puVar12 >> 0x14 & 0xf;
    uVar14 = *puVar12 >> 0x10 & 0xf;
    if (uVar15 == 0) {
      *pauVar2 = (undefined1  [16])0x0;
      pauVar2[1] = (undefined1  [16])0x0;
      pauVar2[2] = (undefined1  [16])0x0;
      pauVar2[3] = (undefined1  [16])0x0;
      pauVar2[4] = (undefined1  [16])0x0;
      pauVar2[5] = (undefined1  [16])0x0;
      pauVar2[6] = (undefined1  [16])0x0;
      pauVar2[7] = (undefined1  [16])0x0;
      uVar11 = (ulong)(uint)(&__vseblocks_posszLens)[uVar14];
    }
    else {
      puVar3 = (undefined8 *)alStack_b8[uVar15];
      uVar4 = puVar3[1];
      uVar5 = puVar3[2];
      uVar6 = puVar3[3];
      uVar7 = puVar3[4];
      uVar8 = puVar3[5];
      uVar9 = puVar3[6];
      uVar10 = puVar3[7];
      *(undefined8 *)*pauVar2 = *puVar3;
      *(undefined8 *)(*pauVar2 + 8) = uVar4;
      *(undefined8 *)pauVar2[1] = uVar5;
      *(undefined8 *)(pauVar2[1] + 8) = uVar6;
      *(undefined8 *)pauVar2[2] = uVar7;
      *(undefined8 *)(pauVar2[2] + 8) = uVar8;
      *(undefined8 *)pauVar2[3] = uVar9;
      *(undefined8 *)(pauVar2[3] + 8) = uVar10;
      uVar11 = (ulong)(uint)(&__vseblocks_possLens)[uVar14];
      alStack_b8[uVar15] = (long)puVar3 + uVar11 * 4;
    }
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + uVar11 * 4);
    uVar15 = *puVar12 >> 0xc & 0xf;
    uVar14 = *puVar12 >> 8 & 0xf;
    if (uVar15 == 0) {
      *pauVar2 = (undefined1  [16])0x0;
      pauVar2[1] = (undefined1  [16])0x0;
      pauVar2[2] = (undefined1  [16])0x0;
      pauVar2[3] = (undefined1  [16])0x0;
      pauVar2[4] = (undefined1  [16])0x0;
      pauVar2[5] = (undefined1  [16])0x0;
      pauVar2[6] = (undefined1  [16])0x0;
      pauVar2[7] = (undefined1  [16])0x0;
      uVar11 = (ulong)(uint)(&__vseblocks_posszLens)[uVar14];
    }
    else {
      puVar3 = (undefined8 *)alStack_b8[uVar15];
      uVar4 = puVar3[1];
      uVar5 = puVar3[2];
      uVar6 = puVar3[3];
      uVar7 = puVar3[4];
      uVar8 = puVar3[5];
      uVar9 = puVar3[6];
      uVar10 = puVar3[7];
      *(undefined8 *)*pauVar2 = *puVar3;
      *(undefined8 *)(*pauVar2 + 8) = uVar4;
      *(undefined8 *)pauVar2[1] = uVar5;
      *(undefined8 *)(pauVar2[1] + 8) = uVar6;
      *(undefined8 *)pauVar2[2] = uVar7;
      *(undefined8 *)(pauVar2[2] + 8) = uVar8;
      *(undefined8 *)pauVar2[3] = uVar9;
      *(undefined8 *)(pauVar2[3] + 8) = uVar10;
      uVar11 = (ulong)(uint)(&__vseblocks_possLens)[uVar14];
      alStack_b8[uVar15] = (long)puVar3 + uVar11 * 4;
    }
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + uVar11 * 4);
    uVar14 = *puVar12 >> 4 & 0xf;
    uVar15 = *puVar12 & 0xf;
    if (uVar14 == 0) {
      *pauVar2 = (undefined1  [16])0x0;
      pauVar2[1] = (undefined1  [16])0x0;
      pauVar2[2] = (undefined1  [16])0x0;
      pauVar2[3] = (undefined1  [16])0x0;
      pauVar2[4] = (undefined1  [16])0x0;
      pauVar2[5] = (undefined1  [16])0x0;
      pauVar2[6] = (undefined1  [16])0x0;
      pauVar2[7] = (undefined1  [16])0x0;
      uVar11 = (ulong)(uint)(&__vseblocks_posszLens)[uVar15];
    }
    else {
      puVar3 = (undefined8 *)alStack_b8[uVar14];
      uVar4 = puVar3[1];
      uVar5 = puVar3[2];
      uVar6 = puVar3[3];
      uVar7 = puVar3[4];
      uVar8 = puVar3[5];
      uVar9 = puVar3[6];
      uVar10 = puVar3[7];
      *(undefined8 *)*pauVar2 = *puVar3;
      *(undefined8 *)(*pauVar2 + 8) = uVar4;
      *(undefined8 *)pauVar2[1] = uVar5;
      *(undefined8 *)(pauVar2[1] + 8) = uVar6;
      *(undefined8 *)pauVar2[2] = uVar7;
      *(undefined8 *)(pauVar2[2] + 8) = uVar8;
      *(undefined8 *)pauVar2[3] = uVar9;
      *(undefined8 *)(pauVar2[3] + 8) = uVar10;
      uVar11 = (ulong)(uint)(&__vseblocks_possLens)[uVar15];
      alStack_b8[uVar14] = (long)puVar3 + uVar11 * 4;
    }
    out = (uint32_t *)(*pauVar2 + uVar11 * 4);
    puVar12 = puVar12 + 1;
  } while (out < pauVar1);
  return puVar12;
}

Assistant:

inline const uint32_t *VSEncodingBlocks::decodeVS(uint32_t len,
                       const uint32_t *in, uint32_t *out, uint32_t *aux) {
  int ntotal;
  uint32_t nblk;
  const uint32_t *addr;
  uint32_t *pblk[VSEBLOCKS_LOGS_LEN];
  uint32_t B;
  uint32_t K;
  uint32_t *end;

  //__validate(in, len);

  ntotal = *in++;
  addr = in + ntotal;

  while (ntotal-- > 0) {
    B = (*in) & (VSEBLOCKS_LOGS_LEN - 1);
    nblk = *(in++) >> VSEBLOCKS_LOGLEN;

    /* Do unpacking */
    (__vseblocks_unpack[B])(aux, addr, nblk);

    pblk[B] = aux;
    aux += nblk;
    addr += (nblk * __vseblocks_possLogs[B] + 31) / 32;
  }

  /*
   * FIXME: We assume that a 32-bit block is processed in a loop here.
   * I might think some amount of 32-bit blocks are processed simutaneously.
   */
  end = out + len;

  do {
    /* Permuting integers with a first 8-bit */
    B = (*addr) >> (VSEBLOCKS_LOGDESC * 3 + VSEBLOCKS_LOGLEN);
    K = (((*addr) >> (VSEBLOCKS_LOGDESC * 3)) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      /*
             * NOTICE: If a max value in __vseblocks_possLens[] is
             * over 16, a code below needs to be fixed.
             * __vseblocks_copy16() just copies 16 values each.
             */ __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      /* FIXME: Is it better to do memcpy() firstly? */ __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a second 8-bit */
    B = ((*addr) >> (VSEBLOCKS_LOGDESC * 2 + VSEBLOCKS_LOGLEN)) &
        (VSEBLOCKS_LOGS_LEN - 1);
    K = (((*addr) >> (VSEBLOCKS_LOGDESC * 2)) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a third 8-bit */
    B = ((*addr) >> (VSEBLOCKS_LOGDESC + VSEBLOCKS_LOGLEN)) &
        (VSEBLOCKS_LOGS_LEN - 1);
    K = (((*addr) >> VSEBLOCKS_LOGDESC) & (VSEBLOCKS_LENS_LEN - 1));

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }

    /* Permuting integers with a fourth 8-bit */
    B = ((*addr) >> VSEBLOCKS_LOGLEN) & (VSEBLOCKS_LOGS_LEN - 1);
    K = (*addr++) & (VSEBLOCKS_LENS_LEN - 1);

    if (B) {
      __vseblocks_copy16(pblk[B], out);
      pblk[B] += __vseblocks_possLens[K];
      out += __vseblocks_possLens[K];
    } else {
      __vseblocks_zero32(out);
      out += __vseblocks_posszLens[K];
    }
  } while (end > out);
  return addr;
}